

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::NewJavascriptObjectNoArg(ScriptContext *requestContext)

{
  bool bVar1;
  ThreadContext *threadContext;
  JavascriptLibrary *this;
  RecyclableObject *obj;
  DynamicObject *local_38;
  DynamicObject *newObject;
  JsReentLock reentrancylock;
  ScriptContext *requestContext_local;
  
  reentrancylock._24_8_ = requestContext;
  threadContext = ScriptContext::GetThreadContext(requestContext);
  JsReentLock::JsReentLock((JsReentLock *)&newObject,threadContext);
  this = ScriptContext::GetLibrary((ScriptContext *)reentrancylock._24_8_);
  local_38 = JavascriptLibrary::CreateObject(this,true,0);
  bVar1 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
  if (bVar1) {
    obj = Js::JavascriptProxy::AutoProxyWrapper(local_38);
    local_38 = VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
  }
  JsReentLock::~JsReentLock((JsReentLock *)&newObject);
  return local_38;
}

Assistant:

Var JavascriptOperators::NewJavascriptObjectNoArg(ScriptContext* requestContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(NewJavascriptObjectNoArg, reentrancylock, requestContext->GetThreadContext());
        DynamicObject * newObject = requestContext->GetLibrary()->CreateObject(true);
        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newObject));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            newObject = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(newObject));
        }
#endif
        return newObject;
        JIT_HELPER_END(NewJavascriptObjectNoArg);
    }